

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int nsPush(xmlParserCtxtPtr ctxt,xmlChar *prefix,xmlChar *URL)

{
  int iVar1;
  xmlChar **ppxVar2;
  xmlChar **tmp;
  int i;
  xmlChar *URL_local;
  xmlChar *prefix_local;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt->options & 0x2000U) != 0) {
    tmp._4_4_ = ctxt->nsNr;
    do {
      iVar1 = tmp._4_4_;
      tmp._4_4_ = iVar1 + -2;
      if (tmp._4_4_ < 0) goto LAB_00187ce2;
    } while (ctxt->nsTab[tmp._4_4_] != prefix);
    if (ctxt->nsTab[iVar1 + -1] == URL) {
      return -2;
    }
  }
LAB_00187ce2:
  if ((ctxt->nsMax == 0) || (ctxt->nsTab == (xmlChar **)0x0)) {
    ctxt->nsMax = 10;
    ctxt->nsNr = 0;
    ppxVar2 = (xmlChar **)(*xmlMalloc)((long)ctxt->nsMax << 3);
    ctxt->nsTab = ppxVar2;
    if (ctxt->nsTab == (xmlChar **)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
      ctxt->nsMax = 0;
      return -1;
    }
  }
  else if (ctxt->nsMax <= ctxt->nsNr) {
    ctxt->nsMax = ctxt->nsMax << 1;
    ppxVar2 = (xmlChar **)(*xmlRealloc)(ctxt->nsTab,(long)ctxt->nsMax << 3);
    if (ppxVar2 == (xmlChar **)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
      ctxt->nsMax = ctxt->nsMax / 2;
      return -1;
    }
    ctxt->nsTab = ppxVar2;
  }
  iVar1 = ctxt->nsNr;
  ctxt->nsNr = iVar1 + 1;
  ctxt->nsTab[iVar1] = prefix;
  iVar1 = ctxt->nsNr;
  ctxt->nsNr = iVar1 + 1;
  ctxt->nsTab[iVar1] = URL;
  return ctxt->nsNr;
}

Assistant:

static int
nsPush(xmlParserCtxtPtr ctxt, const xmlChar *prefix, const xmlChar *URL)
{
    if (ctxt->options & XML_PARSE_NSCLEAN) {
        int i;
	for (i = ctxt->nsNr - 2;i >= 0;i -= 2) {
	    if (ctxt->nsTab[i] == prefix) {
		/* in scope */
	        if (ctxt->nsTab[i + 1] == URL)
		    return(-2);
		/* out of scope keep it */
		break;
	    }
	}
    }
    if ((ctxt->nsMax == 0) || (ctxt->nsTab == NULL)) {
	ctxt->nsMax = 10;
	ctxt->nsNr = 0;
	ctxt->nsTab = (const xmlChar **)
	              xmlMalloc(ctxt->nsMax * sizeof(xmlChar *));
	if (ctxt->nsTab == NULL) {
	    xmlErrMemory(ctxt, NULL);
	    ctxt->nsMax = 0;
            return (-1);
	}
    } else if (ctxt->nsNr >= ctxt->nsMax) {
        const xmlChar ** tmp;
        ctxt->nsMax *= 2;
        tmp = (const xmlChar **) xmlRealloc((char *) ctxt->nsTab,
				    ctxt->nsMax * sizeof(ctxt->nsTab[0]));
        if (tmp == NULL) {
            xmlErrMemory(ctxt, NULL);
	    ctxt->nsMax /= 2;
            return (-1);
        }
	ctxt->nsTab = tmp;
    }
    ctxt->nsTab[ctxt->nsNr++] = prefix;
    ctxt->nsTab[ctxt->nsNr++] = URL;
    return (ctxt->nsNr);
}